

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O0

void IoTHubClientCore_LL_ReportedStateComplete(uint32_t item_id,int status_code,void *ctx)

{
  PDLIST_ENTRY pDVar1;
  LOGGER_LOG p_Var2;
  IOTHUB_DEVICE_TWIN *queue_data;
  PDLIST_ENTRY next_item;
  DLIST_ENTRY *client_item;
  IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *handleData;
  LOGGER_LOG l;
  void *ctx_local;
  int status_code_local;
  uint32_t item_id_local;
  
  if (ctx == (void *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"IoTHubClientCore_LL_ReportedStateComplete",0x24d,1,"Invalid argument handle=%p",0)
      ;
    }
  }
  else {
    pDVar1 = *(PDLIST_ENTRY *)((long)ctx + 0x20);
    do {
      next_item = pDVar1;
      if (next_item == (PDLIST_ENTRY)((long)ctx + 0x20)) {
        return;
      }
      pDVar1 = next_item->Flink;
    } while (*(uint32_t *)&next_item[-3].Blink != item_id);
    if (next_item[-2].Blink != (DLIST_ENTRY_TAG *)0x0) {
      (*(code *)next_item[-2].Blink)(status_code,next_item[-1].Blink);
    }
    DList_RemoveEntryList(next_item);
    device_twin_data_destroy((IOTHUB_DEVICE_TWIN *)&next_item[-3].Blink);
  }
  return;
}

Assistant:

static void IoTHubClientCore_LL_ReportedStateComplete(uint32_t item_id, int status_code, void* ctx)
{
    if (ctx == NULL)
    {
        /*"shall return"*/
        LogError("Invalid argument handle=%p", ctx);
    }
    else
    {
        IOTHUB_CLIENT_CORE_LL_HANDLE_DATA* handleData = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA*)ctx;

        DLIST_ENTRY* client_item = handleData->iot_ack_queue.Flink;
        while (client_item != &(handleData->iot_ack_queue)) /*while we are not at the end of the list*/
        {
            PDLIST_ENTRY next_item = client_item->Flink;
            IOTHUB_DEVICE_TWIN* queue_data = containingRecord(client_item, IOTHUB_DEVICE_TWIN, entry);
            if (queue_data->item_id == item_id)
            {
                if (queue_data->reported_state_callback != NULL)
                {
                    queue_data->reported_state_callback(status_code, queue_data->context);
                }
                DList_RemoveEntryList(client_item);
                device_twin_data_destroy(queue_data);
                break;
            }
            client_item = next_item;
        }
    }
}